

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_db_archive.cpp
# Opt level: O0

void __thiscall
DbArchive_WriteAUint64Span_Test::~DbArchive_WriteAUint64Span_Test
          (DbArchive_WriteAUint64Span_Test *this)

{
  DbArchive_WriteAUint64Span_Test *this_local;
  
  ~DbArchive_WriteAUint64Span_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (DbArchive, WriteAUint64Span) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    std::array<std::uint64_t, 2> const original{{
        UINT64_C (0xF0F0F0F0F0F0F0F0),
        UINT64_C (0xFEEDFACECAFEBEEF),
    }};

    // Write the 'original' array span to the store using a serializer.
    mock_mutex mutex;
    auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
    auto where = pstore::address{db.size ()};
    pstore::serialize::write (pstore::serialize::archive::make_writer (transaction),
                              pstore::gsl::make_span (original));

    // Now read that value back again using the raw pstore API and check that the round-trip was
    // successful.
    auto where2 = pstore::typed_address<std::uint64_t>::make (
        where.absolute () + pstore::calc_alignment (where.absolute (), alignof (std::uint64_t)));
    std::shared_ptr<std::uint64_t const> actual = db.getro (where2, 2);
    EXPECT_EQ (original[0], (actual.get ())[0]);
    EXPECT_EQ (original[1], (actual.get ())[1]);
}